

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

ostream * jsonnet::internal::operator<<(ostream *o,Kind v)

{
  char *pcVar1;
  
  pcVar1 = Token::toString(v);
  std::operator<<(o,pcVar1);
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, Token::Kind v)
{
    o << Token::toString(v);
    return o;
}